

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O1

void cf_gf128_double(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t ii;
  long lVar5;
  byte bVar6;
  uint8_t table [2];
  
  table[0] = '\0';
  table[1] = 0x87;
  uVar1 = in[3];
  uVar4 = uVar1 * 2;
  out[3] = uVar4;
  uVar2 = in[2];
  out[2] = uVar1 >> 0x1f | uVar2 << 1;
  uVar1 = in[1];
  out[1] = uVar2 >> 0x1f | uVar1 << 1;
  uVar3 = *in;
  *out = uVar1 >> 0x1f | uVar3 << 1;
  lVar5 = 0;
  bVar6 = 0;
  do {
    if ((char)((byte)(uVar3 >> 0x1f) ^ (byte)lVar5) < '\x01') {
      bVar6 = table[lVar5];
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  out[3] = uVar4 ^ bVar6;
  return;
}

Assistant:

void cf_gf128_double(const cf_gf128 in, cf_gf128 out)
{
  uint8_t table[2] = { 0x00, 0x87 };
  uint32_t borrow = 0;
  uint32_t inword;

  inword = in[3];   out[3] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[2];   out[2] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[1];   out[1] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[0];   out[0] = (inword << 1) | borrow;  borrow = inword >> 31;

#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  out[3] ^= select_u8(borrow, table, 2);
#else
  out[3] ^= table[borrow];
#endif
}